

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

yyjson_mut_val *
duckdb_yyjson::yyjson_patch
          (yyjson_mut_doc *doc,yyjson_val *orig,yyjson_val *patch,yyjson_patch_err *err)

{
  char **ppcVar1;
  char cVar2;
  yyjson_ptr_code yVar3;
  yyjson_val *pyVar4;
  uint uVar5;
  patch_op pVar6;
  int iVar7;
  yyjson_mut_val *pyVar8;
  ulong uVar9;
  yyjson_val *pyVar10;
  char *pcVar11;
  yyjson_mut_val *pyVar12;
  char *pcVar13;
  size_t ptr_len;
  yyjson_val *pyVar14;
  yyjson_val *pyVar15;
  yyjson_val *pyVar16;
  yyjson_val *pyVar17;
  yyjson_val *pyVar18;
  size_t len_1;
  ulong uVar19;
  yyjson_ptr_err *err_00;
  yyjson_mut_val *val;
  bool bVar20;
  yyjson_ptr_code local_bc;
  char *local_a8;
  yyjson_patch_err err_tmp;
  
  if (err == (yyjson_patch_err *)0x0) {
    err = &err_tmp;
    err_00 = &err_tmp.ptr;
  }
  else {
    err_00 = &err->ptr;
  }
  (err->ptr).msg = (char *)0x0;
  (err->ptr).pos = 0;
  err->msg = (char *)0x0;
  *(undefined8 *)&err->ptr = 0;
  *(undefined8 *)err = 0;
  err->idx = 0;
  if (((doc == (yyjson_mut_doc *)0x0) || (orig == (yyjson_val *)0x0)) ||
     (patch == (yyjson_val *)0x0)) {
    if ((err->ptr).code != 6) {
      err->code = 1;
      pcVar13 = "input parameter is NULL";
LAB_01b87334:
      err->msg = pcVar13;
LAB_01b87339:
      err->idx = 0;
      return (yyjson_mut_val *)0x0;
    }
    err->code = 2;
    pcVar13 = "input parameter is NULL";
  }
  else {
    if ((patch->tag & 7) == 6) {
      pyVar8 = yyjson_val_mut_copy(doc,orig);
      if (pyVar8 != (yyjson_mut_val *)0x0) {
        pyVar15 = (yyjson_val *)0x0;
        pyVar14 = patch + 1;
        pyVar4 = (yyjson_val *)(patch->tag >> 8);
        if (((uint)patch->tag & 7) != 6) {
          pyVar14 = pyVar15;
          pyVar4 = pyVar15;
        }
        ppcVar1 = &err_00->msg;
        pcVar13 = (char *)0x10;
        local_a8 = "input parameter is NULL";
        local_bc = 1;
        do {
          val = pyVar8;
          pyVar16 = pyVar15;
          if (pyVar16 == pyVar4) {
            return val;
          }
          uVar5 = ~(uint)pyVar14->tag;
          pcVar11 = pcVar13;
          if ((uVar5 & 6) == 0) {
            pcVar11 = (pyVar14->uni).str;
          }
          if ((uVar5 & 7) != 0) {
            if ((err->ptr).code != 6) {
              err->code = 3;
              pcVar13 = "JSON patch operation is not object";
LAB_01b871a5:
              err->msg = pcVar13;
              err->idx = (size_t)pyVar16;
              return (yyjson_mut_val *)0x0;
            }
            err->code = 2;
            pcVar13 = "JSON patch operation is not object";
            goto LAB_01b871c6;
          }
          pyVar18 = (yyjson_val *)(pcVar11 + (long)pyVar14);
          pyVar15 = (yyjson_val *)((long)&pyVar16->tag + 1);
          uVar19 = pyVar14->tag >> 8;
          pyVar14 = pyVar14 + 1;
          uVar9 = uVar19;
          pyVar17 = pyVar14;
          while( true ) {
            bVar20 = uVar9 == 0;
            uVar9 = uVar9 - 1;
            if (bVar20) {
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar13 = "missing key `op`";
                goto LAB_01b871c6;
              }
              err->code = 4;
              pcVar13 = "missing key `op`";
              goto LAB_01b871a5;
            }
            if (((pyVar17->tag & 0xffffffffffffff00) == 0x200) &&
               (*(short *)(pyVar17->uni).str == 0x706f)) break;
            pcVar11 = pcVar13;
            if ((~(uint)pyVar17[1].tag & 6) == 0) {
              pcVar11 = pyVar17[1].uni.str;
            }
            pyVar17 = (yyjson_val *)(pcVar11 + (long)(pyVar17 + 1));
          }
          if ((pyVar17[1].tag & 7) != 5) {
            if ((err->ptr).code != 6) {
              err->code = 5;
              pcVar13 = "invalid member `op`";
              goto LAB_01b871a5;
            }
            err->code = 2;
            pcVar13 = "invalid member `op`";
            goto LAB_01b871c6;
          }
          pVar6 = patch_op_get(pyVar17 + 1);
          uVar9 = uVar19;
          pyVar17 = pyVar14;
          while( true ) {
            bVar20 = uVar9 == 0;
            uVar9 = uVar9 - 1;
            if (bVar20) {
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar13 = "missing key `path`";
                goto LAB_01b871c6;
              }
              err->code = 4;
              pcVar13 = "missing key `path`";
              goto LAB_01b871e9;
            }
            if (((pyVar17->tag & 0xffffffffffffff00) == 0x400) &&
               (*(int *)(pyVar17->uni).str == 0x68746170)) break;
            pcVar11 = pcVar13;
            if ((~(uint)pyVar17[1].tag & 6) == 0) {
              pcVar11 = pyVar17[1].uni.str;
            }
            pyVar17 = (yyjson_val *)(pcVar11 + (long)(pyVar17 + 1));
          }
          uVar9 = pyVar17[1].tag;
          if (((uint)uVar9 & 7) != 5) {
            if ((err->ptr).code == 6) {
              err->code = 2;
              pcVar13 = "invalid member `path`";
              goto LAB_01b871c6;
            }
            err->code = 5;
            pcVar13 = "invalid member `path`";
            goto LAB_01b871e9;
          }
          if (pVar6 < PATCH_OP_NONE) {
            if ((0x25U >> (pVar6 & 0x1f) & 1) != 0) {
              while( true ) {
                bVar20 = uVar19 == 0;
                uVar19 = uVar19 - 1;
                if (bVar20) {
                  if ((err->ptr).code == 6) {
                    err->code = 2;
                    pcVar13 = "missing key `value`";
                    goto LAB_01b871c6;
                  }
                  err->code = 4;
                  pcVar13 = "missing key `value`";
                  goto LAB_01b871e9;
                }
                if (((pyVar14->tag & 0xffffffffffffff00) == 0x500) &&
                   (iVar7 = bcmp((pyVar14->uni).ptr,"value",5), iVar7 == 0)) break;
                pcVar11 = pcVar13;
                if ((~(uint)pyVar14[1].tag & 6) == 0) {
                  pcVar11 = pyVar14[1].uni.str;
                }
                pyVar14 = (yyjson_val *)(pcVar11 + (long)(pyVar14 + 1));
              }
              pyVar8 = yyjson_val_mut_copy(doc,pyVar14 + 1);
              if (pyVar8 != (yyjson_mut_val *)0x0) {
                pyVar10 = (yyjson_val *)0x0;
                ptr_len = 0;
                goto LAB_01b86d3d;
              }
              yVar3 = (err->ptr).code;
              err->code = 2;
              err->msg = "failed to copy value";
joined_r0x01b8741a:
              if (yVar3 != 6) {
                err->idx = (size_t)pyVar16;
                return (yyjson_mut_val *)0x0;
              }
              goto LAB_01b871ca;
            }
            pyVar10 = (yyjson_val *)0x0;
            pyVar8 = (yyjson_mut_val *)0x0;
            ptr_len = 0;
            if ((0x18U >> (pVar6 & 0x1f) & 1) == 0) goto LAB_01b86d3d;
            while( true ) {
              bVar20 = uVar19 == 0;
              uVar19 = uVar19 - 1;
              if (bVar20) {
                if ((err->ptr).code == 6) {
                  err->code = 2;
                  pcVar13 = "missing key `from`";
                  goto LAB_01b871c6;
                }
                err->code = 4;
                pcVar13 = "missing key `from`";
                goto LAB_01b871e9;
              }
              if (((pyVar14->tag & 0xffffffffffffff00) == 0x400) &&
                 (*(int *)(pyVar14->uni).str == 0x6d6f7266)) break;
              pcVar11 = pcVar13;
              if ((~(uint)pyVar14[1].tag & 6) == 0) {
                pcVar11 = pyVar14[1].uni.str;
              }
              pyVar14 = (yyjson_val *)(pcVar11 + (long)(pyVar14 + 1));
            }
            if (((uint)pyVar14[1].tag & 7) != 5) {
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar13 = "invalid member `from`";
                goto LAB_01b871c6;
              }
              err->code = 5;
              pcVar13 = "invalid member `from`";
              goto LAB_01b871e9;
            }
            pyVar10 = pyVar14 + 1;
            ptr_len = pyVar14[1].tag >> 8;
            pyVar8 = (yyjson_mut_val *)0x0;
          }
          else {
            pyVar10 = (yyjson_val *)0x0;
            pyVar8 = (yyjson_mut_val *)0x0;
            ptr_len = 0;
          }
LAB_01b86d3d:
          if (PATCH_OP_TEST < pVar6) {
            if ((err->ptr).code == 6) {
              err->code = 2;
              pcVar13 = "unsupported `op`";
              goto LAB_01b871c6;
            }
            err->code = 5;
            pcVar13 = "unsupported `op`";
            goto LAB_01b871e9;
          }
          uVar19 = uVar9 >> 8;
          pyVar14 = pyVar18;
          switch(pVar6) {
          case PATCH_OP_ADD:
            if (0xff < uVar9) {
              pcVar11 = pyVar17[1].uni.str;
              (err->ptr).code = 0;
              *ppcVar1 = (char *)0x0;
              err_00->pos = 0;
              if (((pyVar8 == (yyjson_mut_val *)0x0) || (val == (yyjson_mut_val *)0x0)) ||
                 (pcVar11 == (char *)0x0)) {
LAB_01b873cd:
                (err->ptr).code = local_bc;
                err_00->msg = local_a8;
                err_00->pos = 0;
              }
              else {
                cVar2 = *pcVar11;
joined_r0x01b87014:
                if (cVar2 != '/') {
LAB_01b873ba:
                  local_bc = 2;
                  local_a8 = "no prefix \'/\'";
                  goto LAB_01b873cd;
                }
                bVar20 = unsafe_yyjson_mut_ptr_putx
                                   (val,pcVar11,uVar19,pyVar8,doc,false,true,(yyjson_ptr_ctx *)0x0,
                                    err_00);
LAB_01b8704a:
                pyVar8 = val;
                if (bVar20 != false) break;
                if ((err->ptr).code == 6) {
                  err->code = 2;
                  pcVar13 = "failed to add `path`";
                  goto LAB_01b871c6;
                }
              }
              err->code = 7;
              pcVar13 = "failed to add `path`";
              goto LAB_01b871e9;
            }
            break;
          case PATCH_OP_REMOVE:
            pcVar11 = pyVar17[1].uni.str;
            (err->ptr).code = 0;
            *ppcVar1 = (char *)0x0;
            err_00->pos = 0;
            if ((val == (yyjson_mut_val *)0x0) || (pcVar11 == (char *)0x0)) {
LAB_01b87510:
              (err->ptr).code = local_bc;
              err_00->msg = local_a8;
              err_00->pos = 0;
            }
            else {
              if (uVar9 < 0x100) {
                local_bc = 5;
                local_a8 = "cannot set root";
                goto LAB_01b87510;
              }
              if (*pcVar11 != '/') {
                local_bc = 2;
                local_a8 = "no prefix \'/\'";
                goto LAB_01b87510;
              }
              pyVar12 = unsafe_yyjson_mut_ptr_removex
                                  (val,pcVar11,uVar19,(yyjson_ptr_ctx *)0x0,err_00);
              pyVar8 = val;
              if (pyVar12 != (yyjson_mut_val *)0x0) break;
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar13 = "failed to remove `path`";
                goto LAB_01b871c6;
              }
            }
            err->code = 7;
            pcVar13 = "failed to remove `path`";
            goto LAB_01b871e9;
          case PATCH_OP_REPLACE:
            if (0xff < uVar9) {
              pcVar11 = pyVar17[1].uni.str;
              (err->ptr).code = 0;
              *ppcVar1 = (char *)0x0;
              err_00->pos = 0;
              if (((pyVar8 == (yyjson_mut_val *)0x0) || (val == (yyjson_mut_val *)0x0)) ||
                 (pcVar11 == (char *)0x0)) {
LAB_01b874c9:
                (err->ptr).code = local_bc;
                err_00->msg = local_a8;
                err_00->pos = 0;
              }
              else {
                if (*pcVar11 != '/') {
                  local_bc = 2;
                  local_a8 = "no prefix \'/\'";
                  goto LAB_01b874c9;
                }
                pyVar12 = unsafe_yyjson_mut_ptr_replacex
                                    (val,pcVar11,uVar19,pyVar8,(yyjson_ptr_ctx *)0x0,err_00);
                pyVar8 = val;
                if (pyVar12 != (yyjson_mut_val *)0x0) break;
                if ((err->ptr).code == 6) {
                  err->code = 2;
                  pcVar13 = "failed to replace `path`";
                  goto LAB_01b871c6;
                }
              }
              err->code = 7;
              pcVar13 = "failed to replace `path`";
              goto LAB_01b871e9;
            }
            break;
          case PATCH_OP_MOVE:
            pyVar8 = val;
            if (ptr_len != 0 || uVar19 != 0) {
              pcVar11 = (pyVar10->uni).str;
              (err->ptr).code = 0;
              *ppcVar1 = (char *)0x0;
              err_00->pos = 0;
              if ((val == (yyjson_mut_val *)0x0) || (pcVar11 == (char *)0x0)) {
LAB_01b875d0:
                (err->ptr).code = local_bc;
                err_00->msg = local_a8;
                err_00->pos = 0;
              }
              else {
                if (ptr_len == 0) {
                  local_bc = 5;
                  local_a8 = "cannot set root";
                  goto LAB_01b875d0;
                }
                if (*pcVar11 != '/') {
                  local_bc = 2;
                  local_a8 = "no prefix \'/\'";
                  goto LAB_01b875d0;
                }
                pyVar8 = unsafe_yyjson_mut_ptr_removex
                                   (val,pcVar11,ptr_len,(yyjson_ptr_ctx *)0x0,err_00);
                if (pyVar8 != (yyjson_mut_val *)0x0) {
                  if (0xff < uVar9) {
                    pcVar11 = pyVar17[1].uni.str;
                    (err->ptr).code = 0;
                    *ppcVar1 = (char *)0x0;
                    err_00->pos = 0;
                    if (pcVar11 != (char *)0x0) {
                      cVar2 = *pcVar11;
                      goto joined_r0x01b87014;
                    }
                    goto LAB_01b873cd;
                  }
                  break;
                }
                if ((err->ptr).code == 6) {
                  err->code = 2;
                  pcVar13 = "failed to remove `from`";
                  goto LAB_01b871c6;
                }
              }
              err->code = 7;
              pcVar13 = "failed to remove `from`";
              goto LAB_01b871e9;
            }
            break;
          case PATCH_OP_COPY:
            pcVar11 = (pyVar10->uni).str;
            (err->ptr).code = 0;
            *ppcVar1 = (char *)0x0;
            err_00->pos = 0;
            if ((val == (yyjson_mut_val *)0x0) || (pcVar11 == (char *)0x0)) {
LAB_01b8746f:
              (err->ptr).code = local_bc;
              err_00->msg = local_a8;
              err_00->pos = 0;
            }
            else {
              pyVar8 = val;
              if (ptr_len == 0) {
LAB_01b86e38:
                if (0xff < uVar9) {
                  pyVar8 = yyjson_mut_val_mut_copy(doc,pyVar8);
                  if (pyVar8 == (yyjson_mut_val *)0x0) {
                    yVar3 = (err->ptr).code;
                    err->code = 2;
                    err->msg = "failed to copy value";
                    goto joined_r0x01b8741a;
                  }
                  pcVar11 = pyVar17[1].uni.str;
                  (err->ptr).code = 0;
                  *ppcVar1 = (char *)0x0;
                  err_00->pos = 0;
                  if (pcVar11 != (char *)0x0) {
                    if (*pcVar11 != '/') goto LAB_01b873ba;
                    bVar20 = unsafe_yyjson_mut_ptr_putx
                                       (val,pcVar11,uVar19,pyVar8,doc,false,true,
                                        (yyjson_ptr_ctx *)0x0,err_00);
                    goto LAB_01b8704a;
                  }
                  goto LAB_01b873cd;
                }
                break;
              }
              if (*pcVar11 != '/') {
                local_bc = 2;
                local_a8 = "no prefix \'/\'";
                goto LAB_01b8746f;
              }
              pyVar8 = unsafe_yyjson_mut_ptr_getx(val,pcVar11,ptr_len,(yyjson_ptr_ctx *)0x0,err_00);
              if (pyVar8 != (yyjson_mut_val *)0x0) goto LAB_01b86e38;
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar13 = "failed to get `from`";
                goto LAB_01b871c6;
              }
            }
            err->code = 7;
            pcVar13 = "failed to get `from`";
            goto LAB_01b871e9;
          case PATCH_OP_TEST:
            pcVar11 = pyVar17[1].uni.str;
            (err->ptr).code = 0;
            *ppcVar1 = (char *)0x0;
            err_00->pos = 0;
            if ((val == (yyjson_mut_val *)0x0) || (pcVar11 == (char *)0x0)) {
LAB_01b87557:
              (err->ptr).code = local_bc;
              err_00->msg = local_a8;
              err_00->pos = 0;
LAB_01b87575:
              err->code = 7;
              pcVar13 = "failed to get `path`";
              goto LAB_01b871e9;
            }
            pyVar12 = val;
            if (0xff < uVar9) {
              if (*pcVar11 != '/') {
                local_bc = 2;
                local_a8 = "no prefix \'/\'";
                goto LAB_01b87557;
              }
              pyVar12 = unsafe_yyjson_mut_ptr_getx(val,pcVar11,uVar19,(yyjson_ptr_ctx *)0x0,err_00);
              if (pyVar12 != (yyjson_mut_val *)0x0) goto LAB_01b87134;
              if ((err->ptr).code != 6) goto LAB_01b87575;
              err->code = 2;
              pcVar13 = "failed to get `path`";
              goto LAB_01b871c6;
            }
LAB_01b87134:
            if ((pyVar8 == (yyjson_mut_val *)0x0) ||
               (bVar20 = unsafe_yyjson_mut_equals(pyVar8,pyVar12), pyVar8 = val, !bVar20)) {
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar13 = "failed to test equal";
LAB_01b871c6:
                err->msg = pcVar13;
LAB_01b871ca:
                *(undefined8 *)err_00 = 0;
                err_00->msg = (char *)0x0;
                err_00->pos = 0;
                return (yyjson_mut_val *)0x0;
              }
              err->code = 6;
              pcVar13 = "failed to test equal";
LAB_01b871e9:
              err->msg = pcVar13;
              err->idx = (size_t)pyVar16;
              return (yyjson_mut_val *)0x0;
            }
          }
        } while( true );
      }
      yVar3 = (err->ptr).code;
      err->code = 2;
      err->msg = "failed to copy value";
      if (yVar3 != 6) goto LAB_01b87339;
      goto LAB_01b872d8;
    }
    if ((err->ptr).code != 6) {
      err->code = 1;
      pcVar13 = "input patch is not array";
      goto LAB_01b87334;
    }
    err->code = 2;
    pcVar13 = "input patch is not array";
  }
  err->msg = pcVar13;
LAB_01b872d8:
  *(undefined8 *)err_00 = 0;
  err_00->msg = (char *)0x0;
  err_00->pos = 0;
  return (yyjson_mut_val *)0x0;
}

Assistant:

yyjson_mut_val *yyjson_patch(yyjson_mut_doc *doc,
                             yyjson_val *orig,
                             yyjson_val *patch,
                             yyjson_patch_err *err) {

    yyjson_mut_val *root;
    yyjson_val *obj;
    yyjson_arr_iter iter;
    yyjson_patch_err err_tmp;
    if (!err) err = &err_tmp;
    memset(err, 0, sizeof(*err));
    memset(&iter, 0, sizeof(iter));

    if (unlikely(!doc || !orig || !patch)) {
        return_err(INVALID_PARAMETER, "input parameter is NULL");
    }
    if (unlikely(!yyjson_is_arr(patch))) {
        return_err(INVALID_PARAMETER, "input patch is not array");
    }
    root = yyjson_val_mut_copy(doc, orig);
    if (unlikely(!root)) return_err_copy();

    /* iterate through the patch array */
    yyjson_arr_iter_init(patch, &iter);
    while ((obj = yyjson_arr_iter_next(&iter))) {
        patch_op op_enum;
        yyjson_val *op, *path, *from = NULL, *value;
        yyjson_mut_val *val = NULL, *test;
        usize path_len, from_len = 0;
        if (unlikely(!unsafe_yyjson_is_obj(obj))) {
            return_err(INVALID_OPERATION, "JSON patch operation is not object");
        }

        /* get required member: op */
        op = yyjson_obj_get(obj, "op");
        if (unlikely(!op)) return_err_key("`op`");
        if (unlikely(!yyjson_is_str(op))) return_err_val("`op`");
        op_enum = patch_op_get(op);

        /* get required member: path */
        path = yyjson_obj_get(obj, "path");
        if (unlikely(!path)) return_err_key("`path`");
        if (unlikely(!yyjson_is_str(path))) return_err_val("`path`");
        path_len = unsafe_yyjson_get_len(path);

        /* get required member: value, from */
        switch ((int)op_enum) {
            case PATCH_OP_ADD: case PATCH_OP_REPLACE: case PATCH_OP_TEST:
                value = yyjson_obj_get(obj, "value");
                if (unlikely(!value)) return_err_key("`value`");
                val = yyjson_val_mut_copy(doc, value);
                if (unlikely(!val)) return_err_copy();
                break;
            case PATCH_OP_MOVE: case PATCH_OP_COPY:
                from = yyjson_obj_get(obj, "from");
                if (unlikely(!from)) return_err_key("`from`");
                if (unlikely(!yyjson_is_str(from))) return_err_val("`from`");
                from_len = unsafe_yyjson_get_len(from);
                break;
            default:
                break;
        }

        /* perform an operation */
        switch ((int)op_enum) {
            case PATCH_OP_ADD: /* add(path, val) */
                if (unlikely(path_len == 0)) { root = val; break; }
                if (unlikely(!ptr_add(path, val))) {
                    return_err(POINTER, "failed to add `path`");
                }
                break;
            case PATCH_OP_REMOVE: /* remove(path) */
                if (unlikely(!ptr_remove(path))) {
                    return_err(POINTER, "failed to remove `path`");
                }
                break;
            case PATCH_OP_REPLACE: /* replace(path, val) */
                if (unlikely(path_len == 0)) { root = val; break; }
                if (unlikely(!ptr_replace(path, val))) {
                    return_err(POINTER, "failed to replace `path`");
                }
                break;
            case PATCH_OP_MOVE: /* val = remove(from), add(path, val) */
                if (unlikely(from_len == 0 && path_len == 0)) break;
                val = ptr_remove(from);
                if (unlikely(!val)) {
                    return_err(POINTER, "failed to remove `from`");
                }
                if (unlikely(path_len == 0)) { root = val; break; }
                if (unlikely(!ptr_add(path, val))) {
                    return_err(POINTER, "failed to add `path`");
                }
                break;
            case PATCH_OP_COPY: /* val = get(from).copy, add(path, val) */
                val = ptr_get(from);
                if (unlikely(!val)) {
                    return_err(POINTER, "failed to get `from`");
                }
                if (unlikely(path_len == 0)) { root = val; break; }
                val = yyjson_mut_val_mut_copy(doc, val);
                if (unlikely(!val)) return_err_copy();
                if (unlikely(!ptr_add(path, val))) {
                    return_err(POINTER, "failed to add `path`");
                }
                break;
            case PATCH_OP_TEST: /* test = get(path), test.eq(val) */
                test = ptr_get(path);
                if (unlikely(!test)) {
                    return_err(POINTER, "failed to get `path`");
                }
                if (unlikely(!yyjson_mut_equals(val, test))) {
                    return_err(EQUAL, "failed to test equal");
                }
                break;
            default:
                return_err(INVALID_MEMBER, "unsupported `op`");
        }
    }
    return root;
}